

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O2

int Mpm_CutCheckDsd6(Mpm_Man_t *p,word t)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  ulong local_18;
  
  local_18 = -(ulong)((uint)t & 1) ^ t;
  piVar3 = Hsh_IntManLookup(p->pHash,(uint *)&local_18);
  if (*piVar3 == -1) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar1 = Vec_IntEntry(p->vConfgRes,*piVar3);
    uVar2 = uVar1 ^ 0x10000;
    if ((t & 1) == 0) {
      uVar2 = uVar1;
    }
  }
  return uVar2;
}

Assistant:

int Mpm_CutCheckDsd6( Mpm_Man_t * p, word t )
{
    int fCompl, Entry, Config;
    if ( (fCompl = (t & 1)) )
        t = ~t;
    Entry = *Hsh_IntManLookup( p->pHash, (unsigned *)&t );
    if ( Entry == -1 )
        return -1;
    Config = Vec_IntEntry( p->vConfgRes, Entry );
    if ( fCompl )
        Config ^= (1 << 16);
    return Config;
}